

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hive_partitioning.cpp
# Opt level: O3

void duckdb::GetHivePartitionValuesTypeSwitch
               (Vector *input,vector<duckdb::HivePartitionKey,_true> *keys,idx_t col_idx,idx_t count
               )

{
  LogicalType *rhs;
  PhysicalType PVar1;
  bool bVar2;
  reference pvVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  Value *pVVar7;
  InternalException *this;
  size_type sVar8;
  interval_t value;
  interval_t value_00;
  interval_t value_01;
  string_t value_02;
  string_t value_03;
  string_t value_04;
  uhugeint_t value_05;
  uhugeint_t value_06;
  uhugeint_t value_07;
  hugeint_t value_08;
  hugeint_t value_09;
  hugeint_t value_10;
  Value result;
  UnifiedVectorFormat format;
  Value local_f0;
  LogicalType local_b0;
  LogicalType local_98;
  element_type *local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  rhs = &input->type;
  PVar1 = (input->type).physical_type_;
  if (PVar1 < VARCHAR) {
    switch(PVar1) {
    case BOOL:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<bool>(&local_f0,*(bool *)((long)(_func_int ***)local_78._8_8_ + uVar4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<bool>
                          (&local_f0,*(bool *)((long)(_func_int ***)local_78._8_8_ + sVar5));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<bool>
                      (&local_f0,*(bool *)((long)(_func_int ***)local_78._8_8_ + sVar5));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case UINT8:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<unsigned_char>
                (&local_f0,*(uint8_t *)((long)(_func_int ***)local_78._8_8_ + uVar4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<unsigned_char>
                          (&local_f0,*(uint8_t *)((long)(_func_int ***)local_78._8_8_ + sVar5));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<unsigned_char>
                      (&local_f0,*(uint8_t *)((long)(_func_int ***)local_78._8_8_ + sVar5));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case INT8:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<signed_char>
                (&local_f0,*(int8_t *)((long)(_func_int ***)local_78._8_8_ + uVar4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<signed_char>
                          (&local_f0,*(int8_t *)((long)(_func_int ***)local_78._8_8_ + sVar5));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<signed_char>
                      (&local_f0,*(int8_t *)((long)(_func_int ***)local_78._8_8_ + sVar5));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case UINT16:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<unsigned_short>
                (&local_f0,*(uint16_t *)((long)(_func_int ***)local_78._8_8_ + uVar4 * 2));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<unsigned_short>
                          (&local_f0,*(uint16_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 2))
                ;
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<unsigned_short>
                      (&local_f0,*(uint16_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 2));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case INT16:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<short>
                (&local_f0,*(int16_t *)((long)(_func_int ***)local_78._8_8_ + uVar4 * 2));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<short>
                          (&local_f0,*(int16_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 2));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<short>
                      (&local_f0,*(int16_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 2));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case UINT32:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<unsigned_int>
                (&local_f0,*(uint32_t *)((long)(_func_int ***)local_78._8_8_ + uVar4 * 4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<unsigned_int>
                          (&local_f0,*(uint32_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4))
                ;
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<unsigned_int>
                      (&local_f0,*(uint32_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case INT32:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<int>
                (&local_f0,*(int32_t *)((long)(_func_int ***)local_78._8_8_ + uVar4 * 4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<int>
                          (&local_f0,*(int32_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<int>
                      (&local_f0,*(int32_t *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case UINT64:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<unsigned_long>(&local_f0,(uint64_t)((_func_int ***)local_78._8_8_)[uVar4]);
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<unsigned_long>
                          (&local_f0,(uint64_t)((_func_int ***)local_78._8_8_)[sVar5]);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<unsigned_long>
                      (&local_f0,(uint64_t)((_func_int ***)local_78._8_8_)[sVar5]);
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case INT64:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<long>(&local_f0,(int64_t)((_func_int ***)local_78._8_8_)[uVar4]);
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<long>(&local_f0,(int64_t)((_func_int ***)local_78._8_8_)[sVar5]);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<long>(&local_f0,(int64_t)((_func_int ***)local_78._8_8_)[sVar5]);
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    default:
switchD_013e8f32_caseD_a:
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_78._0_8_ = local_68;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_78,
                 "Unsupported type for HivePartitionedColumnData::ComputePartitionIndices","");
      InternalException::InternalException(this,(string *)local_78);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    case FLOAT:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<float>
                (&local_f0,*(float *)((long)(_func_int ***)local_78._8_8_ + uVar4 * 4));
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<float>
                          (&local_f0,*(float *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4));
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<float>
                      (&local_f0,*(float *)((long)(_func_int ***)local_78._8_8_ + sVar5 * 4));
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case DOUBLE:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      Value::CreateValue<double>(&local_f0,(double)((_func_int ***)local_78._8_8_)[uVar4]);
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                Value::CreateValue<double>(&local_f0,(double)((_func_int ***)local_78._8_8_)[sVar5])
                ;
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            Value::CreateValue<double>(&local_f0,(double)((_func_int ***)local_78._8_8_)[sVar5]);
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pvVar3 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            Value::operator=(pvVar3,&local_f0);
            Value::~Value(&local_f0);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pvVar3 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            Value::operator=(pvVar3,&local_f0);
            Value::~Value(&local_f0);
          }
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case INTERVAL:
      UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
      Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
      local_80 = (element_type *)local_78._8_8_;
      if (*(uint **)local_78._0_8_ == (uint *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = (ulong)**(uint **)local_78._0_8_;
      }
      value.micros = local_78._8_8_;
      value._0_8_ = *(undefined8 *)((ExtraTypeInfoType *)(local_78._8_8_ + 8) + uVar4 * 0x10);
      Value::CreateValue<duckdb::interval_t>
                (&local_f0,(Value *)((_func_int ***)local_78._8_8_)[uVar4 * 2],value);
      if (local_f0.type_.id_ == rhs->id_) {
        bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
        Value::~Value(&local_f0);
        if (bVar2) {
          if (count != 0) {
            sVar8 = 0;
            do {
              pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
              sVar5 = sVar8;
              if (*(long *)local_78._0_8_ != 0) {
                sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
              }
              if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
                 ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
                value_00.micros = (int64_t)local_80;
                value_00._0_8_ = *(undefined8 *)(&local_80->type + sVar5 * 0x10);
                Value::CreateValue<duckdb::interval_t>
                          (&local_f0,(Value *)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2],value_00);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              else {
                LogicalType::LogicalType(&local_b0,SQLNULL);
                Value::Value(&local_f0,&local_b0);
                LogicalType::~LogicalType(&local_b0);
                LogicalType::LogicalType(&local_98,rhs);
                Value::Reinterpret(&local_f0,&local_98);
                LogicalType::~LogicalType(&local_98);
                pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
              }
              Value::operator=(pVVar7,&local_f0);
              Value::~Value(&local_f0);
              sVar8 = sVar8 + 1;
            } while (count != sVar8);
          }
          break;
        }
      }
      else {
        Value::~Value(&local_f0);
      }
      if (count != 0) {
        sVar8 = 0;
        do {
          pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
          sVar5 = sVar8;
          if (*(long *)local_78._0_8_ != 0) {
            sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
          }
          if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
             ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
            value_01.micros = (int64_t)local_80;
            value_01._0_8_ = *(undefined8 *)(&local_80->type + sVar5 * 0x10);
            Value::CreateValue<duckdb::interval_t>
                      (&local_f0,(Value *)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2],value_01);
            LogicalType::LogicalType(&local_b0,rhs);
            Value::Reinterpret(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          else {
            LogicalType::LogicalType(&local_b0,SQLNULL);
            Value::Value(&local_f0,&local_b0);
            LogicalType::~LogicalType(&local_b0);
            LogicalType::LogicalType(&local_98,rhs);
            Value::Reinterpret(&local_f0,&local_98);
            LogicalType::~LogicalType(&local_98);
            pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
          }
          Value::operator=(pVVar7,&local_f0);
          Value::~Value(&local_f0);
          sVar8 = sVar8 + 1;
        } while (count != sVar8);
      }
      break;
    case LIST:
    case STRUCT:
      if (count == 0) {
        return;
      }
      sVar8 = 0;
      do {
        pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
        Vector::GetValue((Value *)local_78,input,sVar8);
        pvVar3 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        Value::operator=(pvVar3,(Value *)local_78);
        Value::~Value((Value *)local_78);
        sVar8 = sVar8 + 1;
      } while (count != sVar8);
      return;
    }
  }
  else if (PVar1 == VARCHAR) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
    local_80 = (element_type *)local_78._8_8_;
    if (*(uint **)local_78._0_8_ == (uint *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)**(uint **)local_78._0_8_;
    }
    value_02.value.pointer.ptr = (char *)local_78._8_8_;
    value_02.value._0_8_ = *(undefined8 *)((ExtraTypeInfoType *)(local_78._8_8_ + 8) + uVar4 * 0x10)
    ;
    Value::CreateValue<duckdb::string_t>
              (&local_f0,(Value *)((_func_int ***)local_78._8_8_)[uVar4 * 2],value_02);
    if (local_f0.type_.id_ == rhs->id_) {
      bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
      Value::~Value(&local_f0);
      if (bVar2) {
        if (count != 0) {
          sVar8 = 0;
          do {
            pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
            sVar5 = sVar8;
            if (*(long *)local_78._0_8_ != 0) {
              sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
            }
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
               ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
              value_03.value.pointer.ptr = (char *)local_80;
              value_03.value._0_8_ = *(undefined8 *)(&local_80->type + sVar5 * 0x10);
              Value::CreateValue<duckdb::string_t>
                        (&local_f0,(Value *)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2],value_03);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            else {
              LogicalType::LogicalType(&local_b0,SQLNULL);
              Value::Value(&local_f0,&local_b0);
              LogicalType::~LogicalType(&local_b0);
              LogicalType::LogicalType(&local_98,rhs);
              Value::Reinterpret(&local_f0,&local_98);
              LogicalType::~LogicalType(&local_98);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            Value::operator=(pVVar7,&local_f0);
            Value::~Value(&local_f0);
            sVar8 = sVar8 + 1;
          } while (count != sVar8);
        }
        goto LAB_013eb74f;
      }
    }
    else {
      Value::~Value(&local_f0);
    }
    if (count != 0) {
      sVar8 = 0;
      do {
        pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
        sVar5 = sVar8;
        if (*(long *)local_78._0_8_ != 0) {
          sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
        }
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
          value_04.value.pointer.ptr = (char *)local_80;
          value_04.value._0_8_ = *(undefined8 *)(&local_80->type + sVar5 * 0x10);
          Value::CreateValue<duckdb::string_t>
                    (&local_f0,(Value *)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2],value_04);
          LogicalType::LogicalType(&local_b0,rhs);
          Value::Reinterpret(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        else {
          LogicalType::LogicalType(&local_b0,SQLNULL);
          Value::Value(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          LogicalType::LogicalType(&local_98,rhs);
          Value::Reinterpret(&local_f0,&local_98);
          LogicalType::~LogicalType(&local_98);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        Value::operator=(pVVar7,&local_f0);
        Value::~Value(&local_f0);
        sVar8 = sVar8 + 1;
      } while (count != sVar8);
    }
  }
  else if (PVar1 == UINT128) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
    local_80 = (element_type *)local_78._8_8_;
    if (*(uint **)local_78._0_8_ == (uint *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)**(uint **)local_78._0_8_;
    }
    value_05.upper = *(uint64_t *)((ExtraTypeInfoType *)(local_78._8_8_ + 8) + uVar4 * 0x10);
    value_05.lower = (uint64_t)((_func_int ***)local_78._8_8_)[uVar4 * 2];
    Value::CreateValue<duckdb::uhugeint_t>(&local_f0,value_05);
    if (local_f0.type_.id_ == rhs->id_) {
      bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
      Value::~Value(&local_f0);
      if (bVar2) {
        if (count != 0) {
          sVar8 = 0;
          do {
            pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
            sVar5 = sVar8;
            if (*(long *)local_78._0_8_ != 0) {
              sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
            }
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
               ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
              value_06.upper = *(uint64_t *)(&local_80->type + sVar5 * 0x10);
              value_06.lower = (uint64_t)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2];
              Value::CreateValue<duckdb::uhugeint_t>(&local_f0,value_06);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            else {
              LogicalType::LogicalType(&local_b0,SQLNULL);
              Value::Value(&local_f0,&local_b0);
              LogicalType::~LogicalType(&local_b0);
              LogicalType::LogicalType(&local_98,rhs);
              Value::Reinterpret(&local_f0,&local_98);
              LogicalType::~LogicalType(&local_98);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            Value::operator=(pVVar7,&local_f0);
            Value::~Value(&local_f0);
            sVar8 = sVar8 + 1;
          } while (count != sVar8);
        }
        goto LAB_013eb74f;
      }
    }
    else {
      Value::~Value(&local_f0);
    }
    if (count != 0) {
      sVar8 = 0;
      do {
        pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
        sVar5 = sVar8;
        if (*(long *)local_78._0_8_ != 0) {
          sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
        }
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
          value_07.upper = *(uint64_t *)(&local_80->type + sVar5 * 0x10);
          value_07.lower = (uint64_t)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2];
          Value::CreateValue<duckdb::uhugeint_t>(&local_f0,value_07);
          LogicalType::LogicalType(&local_b0,rhs);
          Value::Reinterpret(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        else {
          LogicalType::LogicalType(&local_b0,SQLNULL);
          Value::Value(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          LogicalType::LogicalType(&local_98,rhs);
          Value::Reinterpret(&local_f0,&local_98);
          LogicalType::~LogicalType(&local_98);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        Value::operator=(pVVar7,&local_f0);
        Value::~Value(&local_f0);
        sVar8 = sVar8 + 1;
      } while (count != sVar8);
    }
  }
  else {
    if (PVar1 != INT128) goto switchD_013e8f32_caseD_a;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
    Vector::ToUnifiedFormat(input,count,(UnifiedVectorFormat *)local_78);
    local_80 = (element_type *)local_78._8_8_;
    if (*(uint **)local_78._0_8_ == (uint *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = (ulong)**(uint **)local_78._0_8_;
    }
    value_08.upper = *(int64_t *)((ExtraTypeInfoType *)(local_78._8_8_ + 8) + uVar4 * 0x10);
    value_08.lower = (uint64_t)((_func_int ***)local_78._8_8_)[uVar4 * 2];
    Value::CreateValue<duckdb::hugeint_t>(&local_f0,value_08);
    if (local_f0.type_.id_ == rhs->id_) {
      bVar2 = LogicalType::EqualTypeInfo(&local_f0.type_,rhs);
      Value::~Value(&local_f0);
      if (bVar2) {
        if (count != 0) {
          sVar8 = 0;
          do {
            pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
            sVar5 = sVar8;
            if (*(long *)local_78._0_8_ != 0) {
              sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
            }
            if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
               ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
              value_09.upper = *(int64_t *)(&local_80->type + sVar5 * 0x10);
              value_09.lower = (uint64_t)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2];
              Value::CreateValue<duckdb::hugeint_t>(&local_f0,value_09);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            else {
              LogicalType::LogicalType(&local_b0,SQLNULL);
              Value::Value(&local_f0,&local_b0);
              LogicalType::~LogicalType(&local_b0);
              LogicalType::LogicalType(&local_98,rhs);
              Value::Reinterpret(&local_f0,&local_98);
              LogicalType::~LogicalType(&local_98);
              pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
            }
            Value::operator=(pVVar7,&local_f0);
            Value::~Value(&local_f0);
            sVar8 = sVar8 + 1;
          } while (count != sVar8);
        }
        goto LAB_013eb74f;
      }
    }
    else {
      Value::~Value(&local_f0);
    }
    if (count != 0) {
      sVar8 = 0;
      do {
        pvVar6 = vector<duckdb::HivePartitionKey,_true>::operator[](keys,sVar8);
        sVar5 = sVar8;
        if (*(long *)local_78._0_8_ != 0) {
          sVar5 = (size_type)*(uint *)(*(long *)local_78._0_8_ + sVar8 * 4);
        }
        if (((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._0_8_ ==
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) ||
           ((*(ulong *)(local_68._0_8_ + (sVar5 >> 6) * 8) >> (sVar5 & 0x3f) & 1) != 0)) {
          value_10.upper = *(int64_t *)(&local_80->type + sVar5 * 0x10);
          value_10.lower = (uint64_t)(&local_80->_vptr_ExtraTypeInfo)[sVar5 * 2];
          Value::CreateValue<duckdb::hugeint_t>(&local_f0,value_10);
          LogicalType::LogicalType(&local_b0,rhs);
          Value::Reinterpret(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        else {
          LogicalType::LogicalType(&local_b0,SQLNULL);
          Value::Value(&local_f0,&local_b0);
          LogicalType::~LogicalType(&local_b0);
          LogicalType::LogicalType(&local_98,rhs);
          Value::Reinterpret(&local_f0,&local_98);
          LogicalType::~LogicalType(&local_98);
          pVVar7 = vector<duckdb::Value,_true>::operator[](&pvVar6->values,col_idx);
        }
        Value::operator=(pVVar7,&local_f0);
        Value::~Value(&local_f0);
        sVar8 = sVar8 + 1;
      } while (count != sVar8);
    }
  }
LAB_013eb74f:
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._16_8_);
  }
  return;
}

Assistant:

static void GetHivePartitionValuesTypeSwitch(Vector &input, vector<HivePartitionKey> &keys, const idx_t col_idx,
                                             const idx_t count) {
	const auto &type = input.GetType();
	switch (type.InternalType()) {
	case PhysicalType::BOOL:
		TemplatedGetHivePartitionValues<bool>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT8:
		TemplatedGetHivePartitionValues<int8_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT16:
		TemplatedGetHivePartitionValues<int16_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT32:
		TemplatedGetHivePartitionValues<int32_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT64:
		TemplatedGetHivePartitionValues<int64_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::INT128:
		TemplatedGetHivePartitionValues<hugeint_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT8:
		TemplatedGetHivePartitionValues<uint8_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT16:
		TemplatedGetHivePartitionValues<uint16_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT32:
		TemplatedGetHivePartitionValues<uint32_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT64:
		TemplatedGetHivePartitionValues<uint64_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::UINT128:
		TemplatedGetHivePartitionValues<uhugeint_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::FLOAT:
		TemplatedGetHivePartitionValues<float>(input, keys, col_idx, count);
		break;
	case PhysicalType::DOUBLE:
		TemplatedGetHivePartitionValues<double>(input, keys, col_idx, count);
		break;
	case PhysicalType::INTERVAL:
		TemplatedGetHivePartitionValues<interval_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::VARCHAR:
		TemplatedGetHivePartitionValues<string_t>(input, keys, col_idx, count);
		break;
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
		GetNestedHivePartitionValues(input, keys, col_idx, count);
		break;
	default:
		throw InternalException("Unsupported type for HivePartitionedColumnData::ComputePartitionIndices");
	}
}